

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

string * Path::get_executable_path_abi_cxx11_(void)

{
  ssize_t sVar1;
  string *in_RDI;
  char target [4096];
  char link_path [4096];
  allocator local_2019;
  char local_2018 [4096];
  char local_1018 [4104];
  
  snprintf(local_1018,0x1000,"/proc/self/%s","exe");
  sVar1 = readlink(local_1018,local_2018,0xfff);
  if (-1 < sVar1) {
    local_2018[sVar1] = '\0';
  }
  std::__cxx11::string::string((string *)in_RDI,local_2018,&local_2019);
  return in_RDI;
}

Assistant:

string get_executable_path()
{
#ifdef _WIN32
	char target[4096];
	DWORD ret = GetModuleFileNameA(GetModuleHandle(nullptr), target, sizeof(target));
	target[ret] = '\0';
	return canonicalize_path(string(target));
#else
	static const char *exts[] = { "exe", "file", "a.out" };
	char link_path[PATH_MAX];
	char target[PATH_MAX];

	for (auto *ext : exts)
	{
		snprintf(link_path, sizeof(link_path), "/proc/self/%s", ext);
		ssize_t ret = readlink(link_path, target, sizeof(target) - 1);
		if (ret >= 0)
			target[ret] = '\0';

		return string(target);
	}

	return "";
#endif
}